

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void INT_REVaction_remove_split_target
               (CMConnection conn,EVstone stone,EVaction action,EVstone target_stone)

{
  int condition;
  CMFormat format;
  int local_40;
  EVstone local_3c;
  EVaction local_38;
  EVstone local_34;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVaction_remove_split_target_req_formats);
  local_40 = condition;
  local_3c = stone;
  local_38 = action;
  local_34 = target_stone;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVaction_remove_split_target_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,(void *)0x0);
  INT_CMwrite(conn,format,&local_40);
  INT_CMCondition_wait(conn->cm,condition);
  return;
}

Assistant:

extern void
INT_REVaction_remove_split_target(CMConnection conn, EVstone stone, EVaction action, EVstone target_stone)
{
    int cond;
    CMFormat f;
    EVaction_remove_split_target_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVaction_remove_split_target_req_formats);
    request.stone = stone;
    request.action = action;
    request.target_stone = target_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVaction_remove_split_target_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}